

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic-tests.cpp
# Opt level: O1

void MultipleAllocations(bool *result)

{
  undefined4 *puVar1;
  TestClass2 *pTVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int i_1;
  int i;
  long lVar5;
  uint64_t memLeakSize;
  size_t memLeakCount;
  TestClass2 *testArray2 [10];
  TestClass1 *testArray1 [10];
  uint64_t local_c8;
  uint64_t local_c0;
  undefined8 auStack_b8 [10];
  undefined8 auStack_68 [10];
  
  lVar5 = 0;
  __start(false,"",false);
  do {
    puVar1 = (undefined4 *)operator_new(4);
    *puVar1 = 0;
    auStack_68[lVar5] = puVar1;
    pTVar2 = (TestClass2 *)operator_new(0x30);
    TestClass2::TestClass2(pTVar2);
    auStack_b8[lVar5] = pTVar2;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10);
  __mem_leak_check(&local_c0,&local_c8,false,"",false);
  if (local_c0 == 0x1e) {
    if (local_c8 == 600) {
      lVar5 = 0;
      do {
        pTVar2 = (TestClass2 *)auStack_b8[lVar5];
        if (pTVar2 != (TestClass2 *)0x0) {
          TestClass2::~TestClass2(pTVar2);
          operator_delete(pTVar2,0x30);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 10);
      __mem_leak_check(&local_c0,&local_c8,false,"",false);
      if (local_c0 == 10) {
        if (local_c8 == 0x28) {
          lVar5 = 0;
          do {
            if ((void *)auStack_68[lVar5] != (void *)0x0) {
              operator_delete((void *)auStack_68[lVar5],4);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != 10);
          __mem_leak_check(&local_c0,&local_c8,false,"",false);
          if ((local_c0 == 0) && (local_c0 = local_c8, local_c8 == 0)) {
            __stop_and_free_all_mem();
            return;
          }
          uVar3 = 0x5f;
          uVar4 = 0;
        }
        else {
          uVar3 = 0x59;
          uVar4 = 0x28;
          local_c0 = local_c8;
        }
      }
      else {
        uVar3 = 0x59;
        uVar4 = 10;
      }
    }
    else {
      uVar3 = 0x53;
      uVar4 = 600;
      local_c0 = local_c8;
    }
  }
  else {
    uVar3 = 0x53;
    uVar4 = 0x1e;
  }
  printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","MultipleAllocations",
         uVar3,local_c0,uVar4);
  *result = false;
  return;
}

Assistant:

TEST_CASE(MultipleAllocations) {

    START_TEST;

    TestClass1* testArray1[10];
    TestClass2* testArray2[10];

    for (int i = 0; i < 10; i++) {
        testArray1[i] = new TestClass1();
        testArray2[i] = new TestClass2();
    }

    CHECK_MEM_LEAK(30, 10*(sizeof(TestClass1) + sizeof(TestClass2) + sizeof(double)));

    for (int i = 0; i < 10; i++) {
        delete testArray2[i];
    }

    CHECK_MEM_LEAK(10, 10*sizeof(TestClass1));

    for (int i = 0; i < 10; i++) {
        delete testArray1[i];
    }

    CHECK_MEM_LEAK(0, 0);

    STOP_TEST;
}